

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddPegoutTxOut
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType net_type,Pubkey *online_pubkey,
          Privkey *master_online_key,string *btc_descriptor,uint32_t bip32_counter,
          ByteData *whitelist,NetType elements_net_type,Address *btc_derive_address)

{
  undefined8 uVar1;
  pointer puVar2;
  bool bVar3;
  undefined1 local_288 [32];
  pointer pSStack_268;
  pointer local_260;
  Pubkey local_248;
  ByteData local_230;
  ConfidentialTransactionController *local_210;
  Amount *local_208;
  ConfidentialAssetId *local_200;
  ByteData local_1f8;
  Script script;
  Script locking_script;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_210 = this;
  local_208 = value;
  local_200 = asset;
  core::Script::Script(&script);
  core::Pubkey::Pubkey(&local_248);
  core::ByteData::ByteData(&local_230);
  bVar3 = core::Pubkey::IsValid(online_pubkey);
  if (bVar3) {
    bVar3 = core::Privkey::IsInvalid(master_online_key);
    if (!bVar3) {
      core::Address::Address((Address *)&locking_script);
      core::ByteData::ByteData(&local_1f8);
      core::ConfidentialTransaction::GetPegoutPubkeyData
                ((PegoutKeyData *)local_288,online_pubkey,master_online_key,btc_descriptor,
                 bip32_counter,whitelist,net_type,&local_1f8,elements_net_type,
                 (Address *)&locking_script);
      puVar2 = local_248.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_288._0_8_;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_288._8_8_;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_288._16_8_;
      local_288._0_8_ = (pointer)0x0;
      local_288._8_8_ = (pointer)0x0;
      local_288._16_8_ = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_288._24_8_;
      local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pSStack_268;
      local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_260;
      local_288._24_8_ = (pointer)0x0;
      pSStack_268 = (pointer)0x0;
      local_260 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
        if ((pointer)local_288._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_288._24_8_);
        }
      }
      if ((pointer)local_288._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_288._0_8_);
      }
      if (local_1f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      core::Address::GetAddress_abi_cxx11_((string *)local_288,(Address *)&locking_script);
      uVar1 = local_288._8_8_;
      if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
        operator_delete((void *)local_288._0_8_);
      }
      if ((pointer)uVar1 != (pointer)0x0) {
        core::Address::GetLockingScript((Script *)local_288,(Address *)&locking_script);
        core::Script::operator=(&script,(Script *)local_288);
        core::Script::~Script((Script *)local_288);
        if (btc_derive_address != (Address *)0x0) {
          core::Address::operator=(btc_derive_address,(Address *)&locking_script);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      core::Script::~Script(&local_a0);
      local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_b8);
      core::TapBranch::~TapBranch(&local_130);
      if (local_148 != (pointer)0x0) {
        operator_delete(local_148);
      }
      if (local_160 != (pointer)0x0) {
        operator_delete(local_160);
      }
      if (locking_script.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(locking_script.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
          locking_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != &locking_script.script_stack_) {
        operator_delete(locking_script.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      goto LAB_003c1e2e;
    }
  }
  core::Address::GetLockingScript(&locking_script,btc_address);
  core::Script::operator=(&script,&locking_script);
  core::Script::~Script(&locking_script);
LAB_003c1e2e:
  core::ScriptUtil::CreatePegoutLogkingScript
            (&locking_script,genesisblock_hash,&script,&local_248,&local_230);
  AddTxOut(__return_storage_ptr__,local_210,&locking_script,local_208,local_200);
  core::Script::~Script(&locking_script);
  if (local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&script);
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxOutReference
ConfidentialTransactionController::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && !master_online_key.IsInvalid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, net_type, ByteData(), elements_net_type, &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);

  return AddTxOut(locking_script, value, asset);
}